

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

void __thiscall despot::BaseRockSample::PrintState(BaseRockSample *this,State *state,ostream *out)

{
  bool bVar1;
  int *piVar2;
  ulong uVar3;
  ostream *poVar4;
  char *local_68;
  int local_50;
  Coord local_4c [4];
  int x_2;
  undefined8 local_44;
  uint local_3c;
  int local_38;
  int status;
  int rock;
  Coord pos;
  int local_28;
  int x_1;
  int y;
  int x;
  ostream *out_local;
  State *state_local;
  BaseRockSample *this_local;
  
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  for (x_1 = 0; x_1 < this->size_ + 2; x_1 = x_1 + 1) {
    std::operator<<(out,"# ");
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  local_28 = this->size_;
  while (local_28 = local_28 + -1, -1 < local_28) {
    std::operator<<(out,"# ");
    for (_pos = 0; _pos < this->size_; _pos = _pos + 1) {
      despot::Coord::Coord((Coord *)&status,_pos,local_28);
      piVar2 = Grid<int>::operator()(&this->grid_,(Coord *)&status);
      local_38 = *piVar2;
      bVar1 = GetRock(this,state,local_38);
      local_3c = (uint)bVar1;
      local_44 = GetRobPos(this,state);
      despot::Coord::Coord(local_4c,_pos,local_28);
      uVar3 = despot::operator==((Coord *)&local_44,local_4c);
      if ((uVar3 & 1) == 0) {
        if (local_38 < 0) {
          std::operator<<(out,". ");
        }
        else {
          poVar4 = (ostream *)std::ostream::operator<<(out,local_38);
          if (local_3c == 0) {
            local_68 = "X";
          }
          else {
            local_68 = "$";
          }
          std::operator<<(poVar4,local_68);
        }
      }
      else {
        std::operator<<(out,"R ");
      }
    }
    poVar4 = std::operator<<(out,"#");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  for (local_50 = 0; local_50 < this->size_ + 2; local_50 = local_50 + 1) {
    std::operator<<(out,"# ");
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BaseRockSample::PrintState(const State& state, ostream& out) const {
	out << endl;
	for (int x = 0; x < size_ + 2; x++)
		out << "# ";
	out << endl;
	for (int y = size_ - 1; y >= 0; y--) {
		out << "# ";
		for (int x = 0; x < size_; x++) {
			Coord pos(x, y);
			int rock = grid_(pos);
			int status = GetRock(&state, rock);
			if (GetRobPos(&state) == Coord(x, y))
				out << "R ";
			else if (rock >= 0)
				out << rock << (status ? "$" : "X");
			else
				out << ". ";
		}
		out << "#" << endl;
	}
	for (int x = 0; x < size_ + 2; x++)
		out << "# ";
	out << endl;
}